

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanIdentifier
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,bool identifyKwds,EncodedCharPtr *pp)

{
  EncodedCharPtr pchMin;
  EncodedCharPtr last;
  size_t sVar1;
  code *pcVar2;
  bool bVar3;
  OLECHAR OVar4;
  tokens tVar5;
  undefined7 extraout_var;
  undefined4 *puVar6;
  undefined7 in_register_00000031;
  uint codePointValue;
  ulong uVar7;
  uint local_4c;
  undefined4 local_48;
  uint local_44;
  EncodedCharPtr local_40;
  EncodedCharPtr p;
  codepoint_t codePoint;
  bool fHasMultiChar;
  
  pchMin = *pp;
  p._7_1_ = 0;
  p._0_4_ = 0xffffffff;
  last = this->m_pchLast;
  if (last <= pchMin) {
    return tkLastKwd;
  }
  local_48 = (undefined4)CONCAT71(in_register_00000031,identifyKwds);
  sVar1 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  local_40 = pchMin;
  OVar4 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                    (&this->super_UTF8EncodingPolicyBase<false>,&local_40,last);
  codePointValue = (uint)(ushort)OVar4;
  local_4c = (uint)(ushort)OVar4;
  if (local_4c < 0x80) {
    if (codePointValue == 0x5c) {
      bVar3 = TryReadEscape(this,&local_40,last,&local_4c);
      uVar7 = CONCAT71(extraout_var,bVar3) & 0xffffffff;
      p._0_4_ = local_4c;
      goto LAB_00f02f4b;
    }
  }
  else {
    p._7_1_ = 1;
    if ((this->es6UnicodeMode == true) &&
       (bVar3 = Js::NumberUtilities::IsSurrogateLowerPart(codePointValue), bVar3)) {
      bVar3 = TryReadCodePointRest<true>
                        (this,codePointValue,&local_40,last,(codepoint_t *)&p,(bool *)((long)&p + 7)
                        );
      if (!bVar3) {
        return tkLastKwd;
      }
      uVar7 = 0;
      goto LAB_00f02f4b;
    }
  }
  uVar7 = 0;
  p._0_4_ = codePointValue;
LAB_00f02f4b:
  if (0x10ffff < (uint)p) {
    local_44 = (uint)uVar7;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x1a5,"(codePoint < 0x110000u)","codePoint < 0x110000u");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    uVar7 = (ulong)local_44;
  }
  bVar3 = Js::CharClassifier::IsIdStart(this->charClassifier,(uint)p);
  if (!bVar3) {
    (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = sVar1;
    return tkLastKwd;
  }
  tVar5 = ScanIdentifierContinue
                    (this,local_48._0_1_,SUB81(uVar7,0),(bool)p._7_1_,pchMin,local_40,pp);
  return tVar5;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanIdentifier(bool identifyKwds, EncodedCharPtr *pp)
{
    EncodedCharPtr p = *pp;
    EncodedCharPtr pchMin = p;

    // JS6 allows unicode characters in the form of \uxxxx escape sequences
    // to be part of the identifier.
    bool fHasEscape = false;
    bool fHasMultiChar = false;

    codepoint_t codePoint = INVALID_CODEPOINT;
    size_t multiUnitsBeforeLast = this->m_cMultiUnits;

    // Check if we started the id
    if (!TryReadCodePoint<true>(p, m_pchLast, &codePoint, &fHasEscape, &fHasMultiChar))
    {
        // If no chars. could be scanned as part of the identifier, return error.
        return tkScanError;
    }

    Assert(codePoint < 0x110000u);
    if (!charClassifier->IsIdStart(codePoint))
    {
        // Put back the last character
        this->RestoreMultiUnits(multiUnitsBeforeLast);

        // If no chars. could be scanned as part of the identifier, return error.
        return tkScanError;
    }

    return ScanIdentifierContinue(identifyKwds, fHasEscape, fHasMultiChar, pchMin, p, pp);
}